

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall van_kampen::Graph::printSelf(Graph *this,ostream *os,graphOutputFormat fmt)

{
  size_type sVar1;
  const_iterator cVar2;
  reference pNVar3;
  size_t i;
  ulong uVar4;
  char *pcVar5;
  size_t i_1;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  key_type local_48;
  key_type local_44;
  _Deque_iterator<van_kampen::Node,_van_kampen::Node_&,_van_kampen::Node_*> *local_40;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  if (fmt == DOT) {
    pcVar5 = "digraph G {\nrankdir=LR;\nlayout=neato;\n";
LAB_0014cba4:
    std::operator<<(os,pcVar5);
  }
  else if (fmt == WOLFRAM_NOTEBOOK) {
    pcVar5 = "Graph[Rule @@@ {";
    goto LAB_0014cba4;
  }
  this_00 = &(this->removedNodes_)._M_h;
  local_40 = &(this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start;
  uVar4 = 0;
  while( true ) {
    sVar1 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(&this->nodes_);
    if (sVar1 <= uVar4) break;
    local_44 = (key_type)uVar4;
    cVar2 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(this_00,&local_44);
    if (cVar2.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
      pNVar3 = std::_Deque_iterator<van_kampen::Node,_van_kampen::Node_&,_van_kampen::Node_*>::
               operator[](local_40,uVar4);
      Node::printSelf(pNVar3,os,fmt);
    }
    uVar4 = uVar4 + 1;
  }
  uVar4 = 0;
  local_38 = this_00;
  while( true ) {
    sVar1 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(&this->nodes_);
    if (sVar1 <= uVar4) break;
    local_48 = (key_type)uVar4;
    cVar2 = std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(this_00,&local_48);
    if (cVar2.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
      pNVar3 = std::_Deque_iterator<van_kampen::Node,_van_kampen::Node_&,_van_kampen::Node_*>::
               operator[](local_40,uVar4);
      sVar1 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(&this->nodes_);
      this_00 = local_38;
      Node::printTransitions(pNVar3,os,fmt,uVar4 == sVar1 - 1);
    }
    uVar4 = uVar4 + 1;
  }
  if (fmt == DOT) {
    pcVar5 = "}\n";
  }
  else {
    if (fmt != WOLFRAM_NOTEBOOK) goto LAB_0014cc9e;
    pcVar5 = "}, GraphLayout -> \"PlanarEmbedding\"]\n";
  }
  std::operator<<(os,pcVar5);
LAB_0014cc9e:
  std::ostream::flush();
  return;
}

Assistant:

void Graph::printSelf(std::ostream &os, graphOutputFormat fmt) const
{
    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "digraph G {\n"
              "rankdir=LR;\n"
              "layout=neato;\n";
        break;
    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "Graph[Rule @@@ {";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }

    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printSelf(os, fmt);
    }
    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printTransitions(os, fmt, i == nodes_.size() - 1);
    }

    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "}\n";
        break;

    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "}, GraphLayout -> \"PlanarEmbedding\"]\n";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }
    os.flush();
}